

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_equal(lua_State *L,int idx1,int idx2)

{
  TValue *pTVar1;
  TValue *pTVar2;
  int in_EDX;
  int in_ESI;
  lua_State *in_RDI;
  GCobj *unaff_retaddr;
  TValue *base;
  cTValue *o2;
  cTValue *o1;
  bool local_41;
  uint local_14;
  undefined8 in_stack_fffffffffffffff8;
  int ne;
  
  ne = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  pTVar1 = index2adr(in_RDI,in_ESI);
  pTVar2 = index2adr(in_RDI,in_EDX);
  if (((pTVar1->field_2).it < 0xffff0000) && ((pTVar2->field_2).it < 0xffff0000)) {
    local_14 = (uint)(pTVar1->n == pTVar2->n);
  }
  else if ((pTVar1->field_2).it == (pTVar2->field_2).it) {
    if ((pTVar1->field_2).it < 0xfffffffd) {
      if ((int)(pTVar1->field_2).it >> 0xf == -2) {
        local_14 = (uint)(pTVar1->u64 == pTVar2->u64);
      }
      else if ((pTVar1->u32).lo == (pTVar2->u32).lo) {
        local_14 = 1;
      }
      else if ((pTVar1->field_2).it < 0xfffffff5) {
        pTVar1 = lj_meta_equal((lua_State *)&o2->field_2,(GCobj *)base,unaff_retaddr,ne);
        if (pTVar1 < (TValue *)0x2) {
          local_14 = (uint)pTVar1;
        }
        else {
          in_RDI->top = pTVar1 + 2;
          lj_vm_call(in_RDI,pTVar1,2);
          in_RDI->top = in_RDI->top + -2;
          local_14 = (uint)(*(uint *)((long)in_RDI->top + 0xc) < 0xfffffffe);
        }
      }
      else {
        local_14 = 0;
      }
    }
    else {
      local_41 = false;
      if (pTVar1 != (TValue *)((ulong)(in_RDI->glref).ptr32 + 0x68)) {
        local_41 = pTVar2 != (TValue *)((ulong)(in_RDI->glref).ptr32 + 0x68);
      }
      local_14 = (uint)local_41;
    }
  }
  else {
    local_14 = 0;
  }
  return local_14;
}

Assistant:

LUA_API int lua_equal(lua_State *L, int idx1, int idx2)
{
  cTValue *o1 = index2adr(L, idx1);
  cTValue *o2 = index2adr(L, idx2);
  if (tvisint(o1) && tvisint(o2)) {
    return intV(o1) == intV(o2);
  } else if (tvisnumber(o1) && tvisnumber(o2)) {
    return numberVnum(o1) == numberVnum(o2);
  } else if (itype(o1) != itype(o2)) {
    return 0;
  } else if (tvispri(o1)) {
    return o1 != niltv(L) && o2 != niltv(L);
#if LJ_64
  } else if (tvislightud(o1)) {
    return o1->u64 == o2->u64;
#endif
  } else if (gcrefeq(o1->gcr, o2->gcr)) {
    return 1;
  } else if (!tvistabud(o1)) {
    return 0;
  } else {
    TValue *base = lj_meta_equal(L, gcV(o1), gcV(o2), 0);
    if ((uintptr_t)base <= 1) {
      return (int)(uintptr_t)base;
    } else {
      L->top = base+2;
      lj_vm_call(L, base, 1+1);
      L->top -= 2;
      return tvistruecond(L->top+1);
    }
  }
}